

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_estimateCompressedSize(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 <= (int)maxSymbolValue; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + (ulong)count[lVar2] * (ulong)(byte)CTable[lVar2 + 1];
  }
  return uVar1 >> 3;
}

Assistant:

size_t HUF_estimateCompressedSize(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue)
{
    HUF_CElt const* ct = CTable + 1;
    size_t nbBits = 0;
    int s;
    for (s = 0; s <= (int)maxSymbolValue; ++s) {
        nbBits += HUF_getNbBits(ct[s]) * count[s];
    }
    return nbBits >> 3;
}